

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pit.c
# Opt level: O2

void ndn_pit_timeout(void *selfptr,size_t param_len,void *param)

{
  ndn_on_timeout_func p_Var1;
  void *pvVar2;
  ndn_time_ms_t nVar3;
  ndn_time_ms_t nVar4;
  ulong uVar5;
  ndn_pit_entry_t *entry;
  
  nVar4 = ndn_time_now_ms();
  entry = (ndn_pit_entry_t *)((long)selfptr + 0x10);
  for (uVar5 = 0; uVar5 < *(ushort *)((long)selfptr + 8); uVar5 = uVar5 + 1) {
    if (entry->nametree_id != 0xffff) {
      if ((entry->on_data != (ndn_on_data_func)0x0) &&
         ((entry->options).lifetime < nVar4 - entry->express_time)) {
        p_Var1 = entry->on_timeout;
        pvVar2 = entry->userdata;
        entry->outgoing_faces = 0;
        entry->on_timeout = (ndn_on_timeout_func)0x0;
        entry->userdata = (void *)0x0;
        entry->express_time = 0;
        entry->on_data = (ndn_on_data_func)0x0;
        if (p_Var1 != (ndn_on_timeout_func)0x0) {
          (*p_Var1)(pvVar2);
        }
      }
      nVar3 = entry->last_time;
      if ((entry->last_time <= nVar4 && nVar4 != nVar3) &&
         ((entry->options).lifetime < nVar4 - nVar3)) {
        ndn_pit_remove_entry((ndn_pit_t *)selfptr,entry);
      }
    }
    entry = entry + 1;
  }
  ndn_msgqueue_post(selfptr,ndn_pit_timeout,0,(void *)0x0);
  return;
}

Assistant:

static void ndn_pit_timeout(void *selfptr, size_t param_len, void *param){
  ndn_pit_t* self = (ndn_pit_t*)selfptr;
  ndn_table_id_t i;
  ndn_time_ms_t now = ndn_time_now_ms();
  ndn_on_timeout_func on_timeout = NULL;
  void* userdata = NULL;

  for(i = 0; i < self->capacity; i ++){
    if(self->slots[i].nametree_id == NDN_INVALID_ID){
      continue;
    }

    // User timeout
    if(self->slots[i].on_data != NULL){
      if(now - self->slots[i].express_time > self->slots[i].options.lifetime){
        on_timeout = self->slots[i].on_timeout;
        userdata = self->slots[i].userdata;
        
        self->slots[i].on_timeout = NULL;
        self->slots[i].on_data = NULL;
        self->slots[i].userdata = NULL;
        self->slots[i].express_time = 0;
        self->slots[i].outgoing_faces = 0;

        if(on_timeout){
          on_timeout(userdata);
        }
      }
    }
    // PIT timeout
    if((now > self->slots[i].last_time) &&
       (now - self->slots[i].last_time > self->slots[i].options.lifetime))
    {
      ndn_pit_remove_entry(self, &self->slots[i]);
    }
  }

  ndn_msgqueue_post(self, ndn_pit_timeout, 0, NULL);
}